

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerArrayTest::prepareUniforms
          (BindingSamplerArrayTest *this,program *program)

{
  GLuint GVar1;
  texture *this_00;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  uint local_94;
  GLuint j;
  GLint expected_binding;
  GLuint i;
  Functions *gl;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  texture *textures [7];
  program *program_local;
  BindingSamplerArrayTest *this_local;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &(this->m_goku_00_texture).m_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,0x100);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  for (j = 0; j < 7; j = j + 1) {
    checkBinding(this,program,j,j + 1);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 8))(j + 0x84c1);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"ActiveTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x2a24);
    Utils::texture::create(textures[(ulong)j - 1],0x10,0x10,0x8058);
    local_94 = 0;
    while( true ) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      if (sVar4 <= local_94) break;
      GVar1 = prepareUniforms::goku_data[j];
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                          (ulong)local_94);
      *pvVar5 = GVar1;
      local_94 = local_94 + 1;
    }
    this_00 = textures[(ulong)j - 1];
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,0);
    Utils::texture::update(this_00,0x10,0x10,0,0x1908,0x1401,pvVar5);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
  return;
}

Assistant:

void BindingSamplerArrayTest::prepareUniforms(Utils::program& program)
{
	static const GLuint goku_data[7] = {
		0x00000000, 0xff000000, 0x00ff0000, 0xffff0000, 0x0000ff00, 0xff00ff00, 0x00ffff00,
	};

	static const GLuint binding_offset = 1;

	Utils::texture* textures[7] = {
		&m_goku_00_texture, &m_goku_01_texture, &m_goku_02_texture, &m_goku_03_texture,
		&m_goku_04_texture, &m_goku_05_texture, &m_goku_06_texture,
	};

	std::vector<GLuint> texture_data;
	texture_data.resize(16 * 16);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLuint i = 0; i < 7; ++i)
	{
		GLint expected_binding = i + binding_offset;

		checkBinding(program, i, expected_binding);

		gl.activeTexture(GL_TEXTURE0 + expected_binding);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		textures[i]->create(16, 16, GL_RGBA8);

		for (GLuint j = 0; j < texture_data.size(); ++j)
		{
			texture_data[j] = goku_data[i];
		}

		textures[i]->update(16, 16, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);
	}
}